

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusTexFormat::adjust_orig_mthd(MthdCelsiusTexFormat *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  uint uVar2;
  result_type rVar3;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar3 & 1) != 0) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffffffc) + 1;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xffffffe7 | 8;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xffffff9f | 0x20;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) == 0) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      (this->super_SingleMthdTest).super_MthdTest.val =
           ((uint)rVar3 & 3) * 0x80 + (uVar2 & 0xfffff07f) + 0xc80;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 1) != 0) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
      (this->super_SingleMthdTest).super_MthdTest.val = (uVar2 & 0xf0000) << 4 | uVar2 & 0xff0fffff;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xf8ffffff | 0x3000000;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0x8fffffff | 0x30000000;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 1) != 0) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar3 & 3) != 0) {
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
      }
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar3 & 3) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.val =
             (this->super_SingleMthdTest).super_MthdTest.val & 0xffff0fff | 0x1000;
      }
    }
  }
  adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 3)
				insrt(val, 0, 2, 1);
			if (rnd() & 3)
				insrt(val, 3, 2, 1);
			if (rnd() & 3)
				insrt(val, 5, 2, 1);
			if (!(rnd() & 3))
				insrt(val, 7, 5, 0x19 + rnd() % 4);
			if (rnd() & 1)
				insrt(val, 20, 4, extr(val, 16, 4));
			if (rnd() & 3)
				insrt(val, 24, 3, 3);
			if (rnd() & 3)
				insrt(val, 28, 3, 3);
			if (rnd() & 1) {
				if (rnd() & 3)
					insrt(val, 2, 1, 0);
				if (rnd() & 3)
					insrt(val, 12, 4, 1);
			}
		}
		adjust_orig_icmd(&orig);
	}